

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O1

void CopyTexture(aiMaterial *mat,Texture *texture,aiTextureType type)

{
  ulong __n;
  _IEEESingle temp;
  int mapMode;
  aiString tex;
  aiTextureMapMode local_430;
  aiString local_42c;
  
  local_42c.length = 0;
  local_42c.data[0] = '\0';
  memset(local_42c.data + 1,0x1b,0x3ff);
  __n = (texture->mMapName)._M_string_length;
  if (__n < 0x400) {
    local_42c.length = (ai_uint32)__n;
    memcpy(local_42c.data,(texture->mMapName)._M_dataplus._M_p,__n);
    local_42c.data[__n] = '\0';
  }
  aiMaterial::AddProperty(mat,&local_42c,"$tex.file",type,0);
  if ((~(uint)texture->mTextureBlend & 0x7f800000) != 0 ||
      ((uint)texture->mTextureBlend & 0x7fffff) == 0) {
    aiMaterial::AddBinaryProperty(mat,texture,4,"$tex.blend",type,0,aiPTI_Float);
  }
  local_430 = texture->mMapMode;
  aiMaterial::AddBinaryProperty(mat,&local_430,4,"$tex.mapmodeu",type,0,aiPTI_Integer);
  aiMaterial::AddBinaryProperty(mat,&local_430,4,"$tex.mapmodev",type,0,aiPTI_Integer);
  if (texture->mMapMode == aiTextureMapMode_Mirror) {
    texture->mScaleU = texture->mScaleU + texture->mScaleU;
    texture->mScaleV = texture->mScaleV + texture->mScaleV;
    texture->mOffsetU = texture->mOffsetU * 0.5;
    texture->mOffsetV = texture->mOffsetV * 0.5;
  }
  aiMaterial::AddBinaryProperty(mat,&texture->mOffsetU,0x14,"$tex.uvtrafo",type,0,aiPTI_Float);
  return;
}

Assistant:

void CopyTexture(aiMaterial& mat, D3DS::Texture& texture, aiTextureType type)
{
    // Setup the texture name
    aiString tex;
    tex.Set( texture.mMapName);
    mat.AddProperty( &tex, AI_MATKEY_TEXTURE(type,0));

    // Setup the texture blend factor
    if (is_not_qnan(texture.mTextureBlend))
        mat.AddProperty<ai_real>( &texture.mTextureBlend, 1, AI_MATKEY_TEXBLEND(type,0));

    // Setup the texture mapping mode
    int mapMode = static_cast<int>(texture.mMapMode);
    mat.AddProperty<int>(&mapMode,1,AI_MATKEY_MAPPINGMODE_U(type,0));
    mat.AddProperty<int>(&mapMode,1,AI_MATKEY_MAPPINGMODE_V(type,0));

    // Mirroring - double the scaling values
    // FIXME: this is not really correct ...
    if (texture.mMapMode == aiTextureMapMode_Mirror)
    {
        texture.mScaleU *= 2.0;
        texture.mScaleV *= 2.0;
        texture.mOffsetU /= 2.0;
        texture.mOffsetV /= 2.0;
    }

    // Setup texture UV transformations
    mat.AddProperty<ai_real>(&texture.mOffsetU,5,AI_MATKEY_UVTRANSFORM(type,0));
}